

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

TypeUnsizedArray * __thiscall
ExpressionContext::GetUnsizedArrayType(ExpressionContext *this,TypeBase *type)

{
  uint uniqueId;
  Allocator *allocator;
  ScopeData *scope;
  TypeBase *type_00;
  SmallArray<ModuleData_*,_128U> *pSVar1;
  bool bVar2;
  ExpressionContext *this_00;
  MemberHandle *this_01;
  VariableData *this_02;
  SynIdentifier *this_03;
  byte local_59;
  ExpressionContext *local_50;
  InplaceStr local_48;
  InplaceStr local_38;
  ExpressionContext *local_28;
  TypeUnsizedArray *result;
  TypeBase *type_local;
  ExpressionContext *this_local;
  
  result = (TypeUnsizedArray *)type;
  type_local = (TypeBase *)this;
  if (type == this->typeVoid) {
    __assert_fail("type != typeVoid",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x6d4,"TypeUnsizedArray *ExpressionContext::GetUnsizedArrayType(TypeBase *)");
  }
  if (type != this->typeAuto) {
    bVar2 = isType<TypeArgumentSet>(type);
    local_59 = 0;
    if (!bVar2) {
      bVar2 = isType<TypeMemberSet>((TypeBase *)result);
      local_59 = 0;
      if (!bVar2) {
        bVar2 = isType<TypeFunctionSet>((TypeBase *)result);
        local_59 = bVar2 ^ 0xff;
      }
    }
    if ((local_59 & 1) == 0) {
      __assert_fail("!isType<TypeArgumentSet>(type) && !isType<TypeMemberSet>(type) && !isType<TypeFunctionSet>(type)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x6da,"TypeUnsizedArray *ExpressionContext::GetUnsizedArrayType(TypeBase *)");
    }
    bVar2 = isType<TypeError>((TypeBase *)result);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      __assert_fail("!isType<TypeError>(type)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x6db,"TypeUnsizedArray *ExpressionContext::GetUnsizedArrayType(TypeBase *)");
    }
    if ((result->super_TypeStruct).super_TypeBase.unsizedArrayType == (TypeUnsizedArray *)0x0) {
      if (0xffff < (result->super_TypeStruct).super_TypeBase.size) {
        __assert_fail("type->size < 64 * 1024",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x6e0,"TypeUnsizedArray *ExpressionContext::GetUnsizedArrayType(TypeBase *)")
        ;
      }
      this_00 = (ExpressionContext *)get<TypeUnsizedArray>(this);
      local_38 = GetUnsizedArrayTypeName(this,(TypeBase *)result);
      TypeUnsizedArray::TypeUnsizedArray((TypeUnsizedArray *)this_00,local_38,(TypeBase *)result);
      local_28 = this_00;
      PushScope(this,(TypeBase *)this_00);
      (local_28->uniqueDependencies).little[6] = (ModuleData *)this->scope;
      pSVar1 = &local_28->uniqueDependencies;
      this_01 = get<MemberHandle>(this);
      this_02 = get<VariableData>(this);
      allocator = this->allocator;
      scope = this->scope;
      type_00 = this->typeInt;
      this_03 = get<SynIdentifier>(this);
      InplaceStr::InplaceStr(&local_48,"size");
      SynIdentifier::SynIdentifier(this_03,local_48);
      uniqueId = this->uniqueVariableId;
      this->uniqueVariableId = uniqueId + 1;
      VariableData::VariableData
                (this_02,allocator,(SynBase *)0x0,scope,4,type_00,this_03,8,uniqueId);
      MemberHandle::MemberHandle(this_01,(SynBase *)0x0,this_02,(SynBase *)0x0);
      IntrusiveList<MemberHandle>::push_back
                ((IntrusiveList<MemberHandle> *)(pSVar1->little + 7),this_01);
      ((local_28->uniqueDependencies).little[8]->name).begin[0x35] = '\x01';
      (local_28->uniqueDependencies).max = 4;
      (local_28->uniqueDependencies).little[0] = (ModuleData *)0xc;
      PopScope(this,SCOPE_TYPE);
      (result->super_TypeStruct).super_TypeBase.unsizedArrayType = (TypeUnsizedArray *)local_28;
      local_50 = local_28;
      SmallArray<TypeBase_*,_128U>::push_back(&this->types,(TypeBase **)&local_50);
      this_local = local_28;
    }
    else {
      this_local = (ExpressionContext *)(result->super_TypeStruct).super_TypeBase.unsizedArrayType;
    }
    return (TypeUnsizedArray *)this_local;
  }
  __assert_fail("type != typeAuto",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                ,0x6d7,"TypeUnsizedArray *ExpressionContext::GetUnsizedArrayType(TypeBase *)");
}

Assistant:

TypeUnsizedArray* ExpressionContext::GetUnsizedArrayType(TypeBase* type)
{
	// Can't have array of void
	assert(type != typeVoid);

	// Can't create array of auto types this way
	assert(type != typeAuto);

	// Can't derive from pseudo types
	assert(!isType<TypeArgumentSet>(type) && !isType<TypeMemberSet>(type) && !isType<TypeFunctionSet>(type));
	assert(!isType<TypeError>(type));

	if(type->unsizedArrayType)
		return type->unsizedArrayType;

	assert(type->size < 64 * 1024);

	// Create new type
	TypeUnsizedArray* result = new (get<TypeUnsizedArray>()) TypeUnsizedArray(GetUnsizedArrayTypeName(*this, type), type);

	PushScope(result);

	result->typeScope = scope;

	result->members.push_back(new (get<MemberHandle>()) MemberHandle(NULL, new (get<VariableData>()) VariableData(allocator, NULL, scope, 4, typeInt, new (get<SynIdentifier>()) SynIdentifier(InplaceStr("size")), NULLC_PTR_SIZE, uniqueVariableId++), NULL));
	result->members.tail->variable->isReadonly = true;

	result->alignment = 4;
	result->size = NULLC_PTR_SIZE + 4;

	PopScope(SCOPE_TYPE);

	// Save it for future use
	type->unsizedArrayType = result;

	types.push_back(result);

	return result;
}